

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

void __thiscall ON_ClippingPlane::Default(ON_ClippingPlane *this)

{
  ON_ClippingPlane *this_local;
  
  memcpy(this,&ON_xy_plane,0x80);
  ON_UuidList::Empty(&this->m_viewport_ids);
  (this->m_plane_id).Data1 = 0;
  (this->m_plane_id).Data2 = 0;
  (this->m_plane_id).Data3 = 0;
  (this->m_plane_id).Data4[0] = '\0';
  (this->m_plane_id).Data4[1] = '\0';
  (this->m_plane_id).Data4[2] = '\0';
  (this->m_plane_id).Data4[3] = '\0';
  (this->m_plane_id).Data4[4] = '\0';
  (this->m_plane_id).Data4[5] = '\0';
  (this->m_plane_id).Data4[6] = '\0';
  (this->m_plane_id).Data4[7] = '\0';
  this->m_bEnabled = true;
  this->m_depth_enabled = false;
  this->m_participation_lists_enabled = false;
  DeleteClippingPlaneData(&this->m_data_store);
  return;
}

Assistant:

void ON_ClippingPlane::Default()
{
  m_plane = ON_xy_plane;
  m_viewport_ids.Empty();
  m_plane_id = ON_nil_uuid;
  m_bEnabled = true;
  m_depth_enabled = false;
  m_participation_lists_enabled = false;
  DeleteClippingPlaneData(m_data_store);
}